

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall TPZFront<float>::~TPZFront(TPZFront<float> *this,void **vtt)

{
  TPZManVector<long,_10> *in_RSI;
  TPZSavable *in_RDI;
  
  in_RDI->_vptr_TPZSavable = (in_RSI->super_TPZVec<long>)._vptr_TPZVec;
  TPZVec<float>::~TPZVec((TPZVec<float> *)in_RSI);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1cc47f5);
  TPZVec<long>::~TPZVec(&in_RSI->super_TPZVec<long>);
  TPZManVector<long,_10>::~TPZManVector(in_RSI);
  TPZSavable::~TPZSavable(in_RDI,&(in_RSI->super_TPZVec<long>).fStore);
  return;
}

Assistant:

TPZFront<TVar>::~TPZFront(){
}